

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# masterserver.cpp
# Opt level: O1

int __thiscall CMasterServer::Save(CMasterServer *this)

{
  IStorage *pIVar1;
  int iVar2;
  uint size;
  undefined4 extraout_var;
  NETADDR *addr;
  int iVar3;
  long lVar4;
  long in_FS_OFFSET;
  char aBuf [256];
  char aAddrStr [48];
  char local_168 [256];
  char local_68 [48];
  long local_38;
  IOHANDLE io;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pIVar1 = this->m_pStorage;
  iVar3 = -1;
  if (pIVar1 != (IStorage *)0x0) {
    iVar2 = (*(pIVar1->super_IInterface)._vptr_IInterface[4])(pIVar1,"masters.cfg",2,0,0,0,0,0);
    io = (IOHANDLE)CONCAT44(extraout_var,iVar2);
    if (io != (IOHANDLE)0x0) {
      addr = &this->m_aMasterServers[0].m_Addr;
      lVar4 = 4;
      do {
        if (addr->type == 0) {
          local_68[0] = '\0';
        }
        else {
          net_addr_str(addr,local_68,0x30,1);
        }
        str_format(local_168,0x100,"%s %s",addr[-6].ip + 0xc,local_68);
        size = str_length(local_168);
        io_write(io,local_168,size);
        io_write_newline(io);
        addr = addr + 0xf;
        lVar4 = lVar4 + -1;
      } while (lVar4 != 0);
      io_close(io);
      iVar3 = 0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar3;
  }
  __stack_chk_fail();
}

Assistant:

virtual int Save()
	{
		if(!m_pStorage)
			return -1;

		// try to open file
		IOHANDLE File = m_pStorage->OpenFile("masters.cfg", IOFLAG_WRITE, IStorage::TYPE_SAVE);
		if(!File)
			return -1;

		for(int i = 0; i < MAX_MASTERSERVERS; i++)
		{
			char aAddrStr[NETADDR_MAXSTRSIZE];
			if(m_aMasterServers[i].m_Addr.type != NETTYPE_INVALID)
				net_addr_str(&m_aMasterServers[i].m_Addr, aAddrStr, sizeof(aAddrStr), true);
			else
				aAddrStr[0] = 0;
			char aBuf[256];
			str_format(aBuf, sizeof(aBuf), "%s %s", m_aMasterServers[i].m_aHostname, aAddrStr);
			io_write(File, aBuf, str_length(aBuf));
			io_write_newline(File);
		}

		io_close(File);
		return 0;
	}